

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O0

void prvTidyFreeAttrPriorityList(TidyDocImpl *doc)

{
  PriorityAttribs *pPVar1;
  uint local_1c;
  uint i;
  PriorityAttribs *priorities;
  TidyDocImpl *doc_local;
  
  pPVar1 = &(doc->attribs).priorityAttribs;
  if (pPVar1->list != (tmbstr *)0x0) {
    for (local_1c = 0; pPVar1->list[local_1c] != (tmbstr)0x0; local_1c = local_1c + 1) {
      (*doc->allocator->vtbl->free)(doc->allocator,pPVar1->list[local_1c]);
    }
    (*doc->allocator->vtbl->free)(doc->allocator,pPVar1->list);
  }
  return;
}

Assistant:

void TY_(FreeAttrPriorityList)( TidyDocImpl* doc )
{
    PriorityAttribs *priorities = &(doc->attribs.priorityAttribs);

    if ( priorities->list )
    {
        uint i = 0;
        while ( priorities->list[i] != NULL )
        {
            TidyFree( doc->allocator, priorities->list[i] );
            i++;
        }

        TidyFree( doc->allocator, priorities->list );
    }
}